

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t count_known_monsters(void)

{
  bool bVar1;
  bool bVar2;
  monster_race *pmVar3;
  _Bool _Var4;
  wchar_t local_28;
  wchar_t k;
  _Bool has_base;
  wchar_t j;
  _Bool classified;
  monster_race *race;
  wchar_t i;
  wchar_t m_count;
  
  race._4_4_ = L'\0';
  race._0_4_ = 0;
  do {
    pmVar3 = r_info;
    if ((int)(uint)z_info->r_max <= (int)race) {
      return race._4_4_;
    }
    bVar2 = false;
    if ((((l_list[(int)race].all_known & 1U) != 0) || (l_list[(int)race].sights != 0)) &&
       (r_info[(int)race].name != (char *)0x0)) {
      for (k = L'\0'; k < n_monster_group + L'\xffffffff'; k = k + L'\x01') {
        bVar1 = false;
        if (monster_group[k].n_inc_bases != L'\0') {
          for (local_28 = L'\0'; local_28 < monster_group[k].n_inc_bases;
              local_28 = local_28 + L'\x01') {
            if (pmVar3[(int)race].base == monster_group[k].inc_bases[local_28]) {
              race._4_4_ = race._4_4_ + L'\x01';
              bVar1 = true;
              bVar2 = true;
              break;
            }
          }
        }
        if ((!bVar1) &&
           (_Var4 = flag_is_inter(pmVar3[(int)race].flags,monster_group[k].inc_flags,0xb), _Var4)) {
          race._4_4_ = race._4_4_ + L'\x01';
          bVar2 = true;
        }
      }
      if (!bVar2) {
        race._4_4_ = race._4_4_ + L'\x01';
      }
    }
    race._0_4_ = (int)race + 1;
  } while( true );
}

Assistant:

static int count_known_monsters(void)
{
	int m_count = 0, i;

	for (i = 0; i < z_info->r_max; ++i) {
		struct monster_race *race = &r_info[i];
		bool classified = false;
		int j;

		if (!l_list[i].all_known && !l_list[i].sights) {
			continue;
		}
		if (!race->name) continue;

		for (j = 0; j < n_monster_group - 1; ++j) {
			bool has_base = false;

			if (monster_group[j].n_inc_bases) {
				int k;

				for (k = 0; k < monster_group[j].n_inc_bases;
						++k) {
					if (race->base == monster_group[j].inc_bases[k]) {
						++m_count;
						has_base = true;
						classified = true;
						break;
					}
				}
			}
			if (!has_base && rf_is_inter(race->flags,
					monster_group[j].inc_flags)) {
				++m_count;
				classified = true;
			}
		}

		if (!classified) {
			++m_count;
		}
	}

	return m_count;
}